

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O2

void __thiscall
CLIntercept::checkRemoveAcceleratorInfo(CLIntercept *this,cl_accelerator_intel accelerator)

{
  _Base_ptr platform;
  cl_int cVar1;
  iterator __position;
  CLdispatchX *pCVar2;
  allocator local_51;
  cl_accelerator_intel accelerator_local;
  cl_uint refCount;
  
  accelerator_local = accelerator;
  std::mutex::lock(&this->m_Mutex);
  __position = std::
               _Rb_tree<_cl_accelerator_intel_*,_std::pair<_cl_accelerator_intel_*const,__cl_platform_id_*>,_std::_Select1st<std::pair<_cl_accelerator_intel_*const,__cl_platform_id_*>_>,_std::less<_cl_accelerator_intel_*>,_std::allocator<std::pair<_cl_accelerator_intel_*const,__cl_platform_id_*>_>_>
               ::find(&(this->m_AcceleratorInfoMap)._M_t,&accelerator_local);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->m_AcceleratorInfoMap)._M_t._M_impl.super__Rb_tree_header) {
    platform = __position._M_node[1]._M_parent;
    pCVar2 = dispatchX(this,(cl_platform_id)platform);
    if (pCVar2->clGetAcceleratorInfoINTEL ==
        (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)
        0x0) {
      std::__cxx11::string::string((string *)&refCount,"clGetAcceleratorInfoINTEL",&local_51);
      getExtensionFunctionAddress(this,(cl_platform_id)platform,(string *)&refCount);
      std::__cxx11::string::~string((string *)&refCount);
    }
    pCVar2 = dispatchX(this,(cl_platform_id)platform);
    if (pCVar2->clGetAcceleratorInfoINTEL !=
        (_func_cl_int_cl_accelerator_intel_cl_accelerator_info_intel_size_t_void_ptr_size_t_ptr *)
        0x0) {
      refCount = 0;
      cVar1 = (*pCVar2->clGetAcceleratorInfoINTEL)
                        (accelerator_local,0x4091,4,&refCount,(size_t *)0x0);
      if ((cVar1 == 0) && (refCount == 1)) {
        std::
        _Rb_tree<_cl_accelerator_intel*,std::pair<_cl_accelerator_intel*const,_cl_platform_id*>,std::_Select1st<std::pair<_cl_accelerator_intel*const,_cl_platform_id*>>,std::less<_cl_accelerator_intel*>,std::allocator<std::pair<_cl_accelerator_intel*const,_cl_platform_id*>>>
        ::erase_abi_cxx11_((_Rb_tree<_cl_accelerator_intel*,std::pair<_cl_accelerator_intel*const,_cl_platform_id*>,std::_Select1st<std::pair<_cl_accelerator_intel*const,_cl_platform_id*>>,std::less<_cl_accelerator_intel*>,std::allocator<std::pair<_cl_accelerator_intel*const,_cl_platform_id*>>>
                            *)&this->m_AcceleratorInfoMap,__position);
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_Mutex);
  return;
}

Assistant:

void CLIntercept::checkRemoveAcceleratorInfo(
    cl_accelerator_intel accelerator )
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CAcceleratorInfoMap::iterator iter = m_AcceleratorInfoMap.find( accelerator );
    if( iter != m_AcceleratorInfoMap.end() )
    {
        cl_platform_id  platform = iter->second;
        if( dispatchX(platform).clGetAcceleratorInfoINTEL == NULL )
        {
            getExtensionFunctionAddress(
                platform,
                "clGetAcceleratorInfoINTEL" );
        }

        const auto& dispatchX = this->dispatchX(platform);
        if( dispatchX.clGetAcceleratorInfoINTEL )
        {
            cl_uint refCount = 0;
            cl_int  errorCode = CL_SUCCESS;

            errorCode = dispatchX.clGetAcceleratorInfoINTEL(
                accelerator,
                CL_ACCELERATOR_REFERENCE_COUNT_INTEL,
                sizeof( refCount ),
                &refCount,
                NULL );
            if( errorCode == CL_SUCCESS && refCount == 1 )
            {
                m_AcceleratorInfoMap.erase( iter );
            }
        }
    }
}